

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O3

IntRect __thiscall sf::RenderTarget::getViewport(RenderTarget *this,View *view)

{
  uint uVar1;
  uint extraout_var;
  FloatRect *pFVar2;
  IntRect IVar3;
  
  uVar1 = (*this->_vptr_RenderTarget[2])();
  (*this->_vptr_RenderTarget[2])(this);
  pFVar2 = View::getViewport(view);
  IVar3.top = (int)(pFVar2->top * (float)extraout_var + 0.5);
  IVar3.left = (int)(pFVar2->left * (float)uVar1 + 0.5);
  IVar3.height = (int)(pFVar2->height * (float)extraout_var + 0.5);
  IVar3.width = (int)(pFVar2->width * (float)uVar1 + 0.5);
  return IVar3;
}

Assistant:

IntRect RenderTarget::getViewport(const View& view) const
{
    float width  = static_cast<float>(getSize().x);
    float height = static_cast<float>(getSize().y);
    const FloatRect& viewport = view.getViewport();

    return IntRect(static_cast<int>(0.5f + width  * viewport.left),
                   static_cast<int>(0.5f + height * viewport.top),
                   static_cast<int>(0.5f + width  * viewport.width),
                   static_cast<int>(0.5f + height * viewport.height));
}